

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.cpp
# Opt level: O0

char * __thiscall TreeModel::index(TreeModel *this,char *__s,int __c)

{
  bool bVar1;
  ulong uVar2;
  TreeItem *adata;
  uint in_ECX;
  QModelIndex *in_R8;
  TreeItem *childItem;
  TreeItem *parentItem;
  QModelIndex *parent_local;
  int column_local;
  int row_local;
  TreeModel *this_local;
  
  uVar2 = QAbstractItemModel::hasIndex((int)__s,__c,(QModelIndex *)(ulong)in_ECX);
  if ((uVar2 & 1) == 0) {
    QModelIndex::QModelIndex((QModelIndex *)this);
  }
  else {
    bVar1 = QModelIndex::isValid(in_R8);
    if (bVar1) {
      childItem = (TreeItem *)QModelIndex::internalPointer(in_R8);
    }
    else {
      childItem = *(TreeItem **)(__s + 0x10);
    }
    adata = TreeItem::child(childItem,__c);
    if (adata == (TreeItem *)0x0) {
      QModelIndex::QModelIndex((QModelIndex *)this);
    }
    else {
      QAbstractItemModel::createIndex
                ((QModelIndex *)this,(QAbstractItemModel *)__s,__c,in_ECX,adata);
    }
  }
  return (char *)this;
}

Assistant:

UModelIndex TreeModel::index(int row, int column, const UModelIndex &parent) const
{
    if (!hasIndex(row, column, parent))
        return UModelIndex();
    
    TreeItem *parentItem;
    
    if (!parent.isValid())
        parentItem = rootItem;
    else
        parentItem = static_cast<TreeItem*>(parent.internalPointer());
    
    TreeItem *childItem = parentItem->child(row);
    if (childItem)
        return createIndex(row, column, childItem);
    else
        return UModelIndex();
}